

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
::DescribeDefaultActionTo
          (FunctionMocker<ot::commissioner::Error_(const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
           *this,ArgumentTuple *args,ostream *os)

{
  OnCallSpec<ot::commissioner::Error_(const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
  *this_00;
  bool bVar1;
  ostream *poVar2;
  int in_ECX;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string local_48;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"returning default value.\n",0x19);
      return;
    }
    this_00 = (OnCallSpec<ot::commissioner::Error_(const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
               *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar1 = OnCallSpec<ot::commissioner::Error_(const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
            ::Matches(this_00,args);
  } while (!bVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"taking default action specified at:\n",0x24);
  FormatFileLocation_abi_cxx11_
            (&local_48,*(internal **)this_00,(char *)(ulong)*(uint *)(this_00 + 8),in_ECX);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == nullptr) {
      *os << (std::is_void<Result>::value ? "returning directly.\n"
                                          : "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }